

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallScriptGenerator::cmInstallScriptGenerator
          (cmInstallScriptGenerator *this,char *script,bool code,char *component,
          bool exclude_from_all)

{
  char *__s;
  size_type sVar1;
  allocator<char> local_55 [13];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  byte local_29;
  char *pcStack_28;
  bool exclude_from_all_local;
  char *component_local;
  char *pcStack_18;
  bool code_local;
  char *script_local;
  cmInstallScriptGenerator *this_local;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_29 = exclude_from_all;
  pcStack_28 = component;
  component_local._7_1_ = code;
  pcStack_18 = script;
  script_local = (char *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,(char *)0x0,&local_48,pcStack_28,MessageDefault,
             (bool)(local_29 & 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  __s = pcStack_18;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallScriptGenerator_00af88f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->Script,__s,local_55);
  std::allocator<char>::~allocator(local_55);
  this->Code = (bool)(component_local._7_1_ & 1);
  this->AllowGenex = false;
  sVar1 = cmGeneratorExpression::Find(&this->Script);
  if (sVar1 != 0xffffffffffffffff) {
    (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  }
  return;
}

Assistant:

cmInstallScriptGenerator::cmInstallScriptGenerator(const char* script,
                                                   bool code,
                                                   const char* component,
                                                   bool exclude_from_all)
  : cmInstallGenerator(nullptr, std::vector<std::string>(), component,
                       MessageDefault, exclude_from_all)
  , Script(script)
  , Code(code)
  , AllowGenex(false)
{
  // We need per-config actions if the script has generator expressions.
  if (cmGeneratorExpression::Find(Script) != std::string::npos) {
    this->ActionsPerConfig = true;
  }
}